

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractDOMParser::AbstractDOMParser
          (AbstractDOMParser *this,XMLValidator *valToAdopt,MemoryManager *manager,
          XMLGrammarPool *gramPool)

{
  XMLBuffer *pXVar1;
  CleanupType_conflict17 cleanup;
  JanitorMemFunCall<xercesc_4_0::AbstractDOMParser> local_28;
  
  (this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler =
       (_func_int **)&PTR__AbstractDOMParser_00416a50;
  (this->super_XMLErrorReporter)._vptr_XMLErrorReporter =
       (_func_int **)&PTR__AbstractDOMParser_00416ba0;
  (this->super_XMLEntityHandler)._vptr_XMLEntityHandler =
       (_func_int **)&PTR__AbstractDOMParser_00416bd0;
  (this->super_DocTypeHandler)._vptr_DocTypeHandler = (_func_int **)&PTR__AbstractDOMParser_00416c18
  ;
  (this->super_PSVIHandler)._vptr_PSVIHandler = (_func_int **)&PTR__AbstractDOMParser_00416cb8;
  this->fCreateEntityReferenceNodes = true;
  this->fIncludeIgnorableWhitespace = true;
  this->fWithinElement = false;
  this->fParseInProgress = false;
  this->fCreateCommentNodes = true;
  *(undefined8 *)&this->fDocumentAdoptedByUser = 0;
  *(undefined8 *)((long)&this->fScanner + 5) = 0;
  *(undefined8 *)((long)&this->fImplementationFeatures + 5) = 0;
  *(undefined8 *)((long)&this->fCurrentParent + 5) = 0;
  *(undefined8 *)((long)&this->fCurrentNode + 5) = 0;
  *(undefined8 *)((long)&this->fCurrentEntity + 5) = 0;
  *(undefined8 *)((long)&this->fDocument + 5) = 0;
  *(undefined8 *)((long)&this->fDocumentType + 5) = 0;
  *(undefined8 *)((long)&this->fDocumentVector + 5) = 0;
  *(undefined8 *)((long)&this->fGrammarResolver + 5) = 0;
  *(undefined4 *)((long)&this->fURIStringPool + 4) = 0;
  this->fValidator = valToAdopt;
  this->fMemoryManager = manager;
  this->fGrammarPool = gramPool;
  XMLBufferMgr::XMLBufferMgr(&this->fBufMgr,manager);
  pXVar1 = XMLBufferMgr::bidOnBuffer(&this->fBufMgr);
  this->fInternalSubset = pXVar1;
  this->fPSVIHandler = (PSVIHandler *)0x0;
  local_28.fToCall = (MFPT)cleanUp;
  local_28._16_8_ = 0;
  local_28.fObject = this;
  initialize(this);
  local_28.fObject = (AbstractDOMParser *)0x0;
  JanitorMemFunCall<xercesc_4_0::AbstractDOMParser>::~JanitorMemFunCall(&local_28);
  return;
}

Assistant:

AbstractDOMParser::AbstractDOMParser( XMLValidator* const   valToAdopt
                                    , MemoryManager* const  manager
                                    , XMLGrammarPool* const gramPool) :

  fCreateEntityReferenceNodes(true)
, fIncludeIgnorableWhitespace(true)
, fWithinElement(false)
, fParseInProgress(false)
, fCreateCommentNodes(true)
, fDocumentAdoptedByUser(false)
, fCreateSchemaInfo(false)
, fDoXInclude(false)
, fScanner(0)
, fImplementationFeatures(0)
, fCurrentParent(0)
, fCurrentNode(0)
, fCurrentEntity(0)
, fDocument(0)
, fDocumentType(0)
, fDocumentVector(0)
, fGrammarResolver(0)
, fURIStringPool(0)
, fValidator(valToAdopt)
, fMemoryManager(manager)
, fGrammarPool(gramPool)
, fBufMgr(manager)
, fInternalSubset(fBufMgr.bidOnBuffer())
, fPSVIHandler(0)
{
    CleanupType cleanup(this, &AbstractDOMParser::cleanUp);

    try
    {
        initialize();
    }
    catch(const OutOfMemoryException&)
    {
        // Don't cleanup when out of memory, since executing the
        // code can cause problems.
        cleanup.release();

        throw;
    }

    cleanup.release();
}